

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContainTest.h
# Opt level: O0

void __thiscall
oout::ContainTest::ContainTest<char_const*>
          (ContainTest *this,shared_ptr<const_oout::Text> *text,string *sub,char *subs)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *subs_local;
  string *sub_local;
  shared_ptr<const_oout::Text> *text_local;
  ContainTest *this_local;
  
  local_28 = subs;
  subs_local = (char *)sub;
  sub_local = (string *)text;
  text_local = (shared_ptr<const_oout::Text> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,subs,&local_49);
  std::make_shared<oout::ContainMatch,std::__cxx11::string_const&>(&local_70);
  ContainTest<std::shared_ptr<oout::ContainMatch>>
            (this,text,&local_48,(shared_ptr<oout::ContainMatch> *)&local_70);
  std::shared_ptr<oout::ContainMatch>::~shared_ptr((shared_ptr<oout::ContainMatch> *)&local_70);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  return;
}

Assistant:

ContainTest(
		const std::shared_ptr<const Text> &text,
		const std::string &sub,
		S ... subs
	) : ContainTest(text, subs..., std::make_shared<ContainMatch>(sub))
	{
	}